

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void defer_delete(void)

{
  undefined8 *puVar1;
  _UnitTest_Compare local_50;
  int local_3c;
  defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:17:5)>
  local_38;
  A *ptr;
  
  ptr = (A *)((ulong)ptr & 0xffffffff00000000);
  local_50.m_ip = 0x103941;
  local_50.m_failed = A::n_objects != 0;
  if (local_50.m_failed) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp",
               0xe);
    UnitTest::_UnitTest_Compare::print("A::n_objects");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&A::n_objects);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print("0");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>((int *)&ptr);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(A::n_objects == (int)ptr);
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::print(' ');
    }
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::printLast();
    }
  }
  ptr = (A *)operator_new(1);
  A::n_objects = A::n_objects + 1;
  local_38.cleanup_function.ptr._0_4_ = 1;
  local_50.m_failed = A::n_objects != 1;
  local_50.m_ip = 0x10397e;
  if (local_50.m_failed) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp",
               0x10);
    UnitTest::_UnitTest_Compare::print("A::n_objects");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&A::n_objects);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print("1");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>((int *)&local_38);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(A::n_objects == (int)local_38.cleanup_function.ptr);
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::print(' ');
    }
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::printLast();
    }
  }
  local_3c = 1;
  local_50.m_failed = A::n_objects != 1;
  local_50.m_ip = 0x1039b1;
  local_38.cleanup_function.ptr =
       (anon_class_8_1_ba1d6e4e_for_cleanup_function)
       (anon_class_8_1_ba1d6e4e_for_cleanup_function)&ptr;
  if (local_50.m_failed) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp",
               0x12);
    UnitTest::_UnitTest_Compare::print("A::n_objects");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&A::n_objects);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print("1");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&local_3c);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(A::n_objects == local_3c);
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::print(' ');
    }
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::printLast();
    }
  }
  ext::detail::
  defer_raii<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp:17:5)>
  ::~defer_raii(&local_38);
  ptr = (A *)((ulong)ptr & 0xffffffff00000000);
  local_50.m_failed = A::n_objects != 0;
  local_50.m_ip = 0x1039e1;
  if (local_50.m_failed) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp",
               0x14);
    UnitTest::_UnitTest_Compare::print("A::n_objects");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&A::n_objects);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print("0");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>((int *)&ptr);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(A::n_objects == (int)ptr);
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::print(' ');
    }
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::printLast();
    }
  }
  puVar1 = (undefined8 *)operator_new__(0x12);
  A::n_objects = A::n_objects + 10;
  *puVar1 = 10;
  ptr = (A *)(puVar1 + 1);
  local_38.cleanup_function.ptr._0_4_ = 10;
  local_50.m_failed = A::n_objects != 10;
  local_50.m_ip = 0x103a29;
  if (local_50.m_failed) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp",
               0x17);
    UnitTest::_UnitTest_Compare::print("A::n_objects");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&A::n_objects);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print("10");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>((int *)&local_38);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(A::n_objects == (int)local_38.cleanup_function.ptr);
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::print(' ');
    }
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::printLast();
    }
  }
  local_3c = 10;
  local_50.m_failed = A::n_objects != 10;
  local_50.m_ip = 0x103a57;
  local_38.cleanup_function.ptr =
       (anon_class_8_1_ba1d6e4e_for_cleanup_function)
       (anon_class_8_1_ba1d6e4e_for_cleanup_function)&ptr;
  if (local_50.m_failed) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp",
               0x19);
    UnitTest::_UnitTest_Compare::print("A::n_objects");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&A::n_objects);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print("10");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&local_3c);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(A::n_objects == local_3c);
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::print(' ');
    }
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::printLast();
    }
  }
  ext::detail::
  defer_raii<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp:24:5)>
  ::~defer_raii((defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:24:5)>
                 *)&local_38);
  ptr = (A *)((ulong)ptr & 0xffffffff00000000);
  local_50.m_failed = A::n_objects != 0;
  local_50.m_ip = 0x103a84;
  if (local_50.m_failed) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp",
               0x1b);
    UnitTest::_UnitTest_Compare::print("A::n_objects");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>(&A::n_objects);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print("0");
    UnitTest::_UnitTest_Compare::print(" (");
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
    UnitTest::_UnitTest_Compare::print<int>((int *)&ptr);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(A::n_objects == (int)ptr);
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::print(' ');
    }
    if ((local_50.m_failed & 1U) != 0) {
      UnitTest::_UnitTest_Compare::printLast();
    }
  }
  return;
}

Assistant:

TEST(defer_delete) {
  {
    COMPARE(A::n_objects, 0);
    A *ptr = new A;
    COMPARE(A::n_objects, 1);
    DEFER({ delete ptr; });
    COMPARE(A::n_objects, 1);
  }
  COMPARE(A::n_objects, 0);
  {
    A *ptr = new A[10];
    COMPARE(A::n_objects, 10);
    DEFER({ delete[] ptr; });
    COMPARE(A::n_objects, 10);
  }
  COMPARE(A::n_objects, 0);
}